

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyFormatter.h
# Opt level: O1

basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
          (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this,char **s)

{
  char *__s;
  size_t sVar1;
  
  __s = *s;
  if (__s == (char *)0x0) {
    std::ios::clear((int)this + (int)*(undefined8 *)(*(long *)this + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,__s,sVar1);
  }
  return (basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
}

Assistant:

basic_formatter& operator, (const TToken& s) {
        underlying << s;
        return *this;
    }